

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignable_var_conversion.cpp
# Opt level: O2

void skiwi::assignable_variable_conversion(Program *prog,compiler_options *ops)

{
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *__v;
  pointer pvVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  pointer pfVar5;
  pointer pcVar6;
  Expressions *__range3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  pointer pvVar8;
  thread *t;
  pointer pfVar9;
  unsigned_long i;
  size_t i_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_d8;
  thread local_c8;
  unsigned_long n_threads;
  convert_assignable_variables cav;
  unsigned_long n_lacking_tasks;
  unsigned_long n_max_tasks_per_thread;
  undefined1 local_70 [8];
  find_assignable_variables fav;
  
  if (prog->alpha_converted == false) {
    __assert_fail("prog.alpha_converted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/assignable_var_conversion.cpp"
                  ,0x1b8,
                  "void skiwi::assignable_variable_conversion(Program &, const compiler_options &)")
    ;
  }
  __v = (prog->expressions).
        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(prog->expressions).
                super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__v;
  if (1 < (ulong)(lVar4 / 0xf0)) {
    __assert_fail("prog.expressions.size() <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/assignable_var_conversion.cpp"
                  ,0x1b9,
                  "void skiwi::assignable_variable_conversion(Program &, const compiler_options &)")
    ;
  }
  if (lVar4 == 0xf0) {
    if ((__v->
        super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        ).
        super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        ._M_index == '\0') {
      local_d8._vptr__Sp_counted_base =
           (_func_int **)
           std::
           get<0ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (__v);
      uVar3 = ((long)(((variant_alternative_t<0UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
                        *)local_d8._vptr__Sp_counted_base)->arguments).
                     super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(((variant_alternative_t<0UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
                       *)local_d8._vptr__Sp_counted_base)->arguments).
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xf0;
      local_70 = (undefined1  [8])0x0;
      if (ops->parallel == false) {
        for (i_00 = 0; uVar3 != i_00; i_00 = i_00 + 1) {
          assignable_variable_conversion::anon_class_8_1_ba1d37e4::operator()
                    ((anon_class_8_1_ba1d37e4 *)&local_d8,i_00);
        }
      }
      else {
        uVar2 = std::thread::hardware_concurrency();
        n_threads = (unsigned_long)uVar2;
        n_max_tasks_per_thread = (uVar3 / n_threads + 1) - (ulong)(uVar3 % n_threads == 0);
        n_lacking_tasks = n_max_tasks_per_thread * n_threads - uVar3;
        fav.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fav.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fav.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pfVar5 = fav.expressions.
                     super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            pfVar9 = fav.expressions.
                     super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                     ._M_impl.super__Vector_impl_data._M_start, p_Var7 < n_threads;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var7->_vptr__Sp_counted_base + 1)) {
          local_c8._M_id._M_thread = (id)0;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
          ((cav.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)&PTR___State_002aae40;
          ((cav.env.
            super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = p_Var7;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&n_threads;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&n_lacking_tasks;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&n_max_tasks_per_thread;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = &local_d8;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[3].
          super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_70;
          std::thread::_M_start_thread(&local_c8,&cav,0);
          if (cav.env.
              super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)&((((cav.env.
                             super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<skiwi::environment<bool>,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->env)._M_t._M_impl.super__Rb_tree_header._M_header)();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                    ((vector<std::thread,_std::allocator<std::thread>_> *)&fav,&local_c8);
          std::thread::~thread(&local_c8);
        }
        for (; pfVar9 != pfVar5; pfVar9 = (pointer)&pfVar9->state) {
          std::thread::join();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&fav);
      }
    }
    else {
      anon_unknown_26::find_assignable_variables::find_assignable_variables(&fav);
      pvVar1 = (prog->expressions).
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar8 = (prog->expressions).
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1
          ) {
        cav.env.
        super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)cav.env.
                              super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        cav.env.
        super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pvVar8;
        std::
        vector<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
        ::push_back(&fav.expressions,(value_type *)&cav);
      }
      if (fav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          fav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        for (; pfVar5 = fav.expressions.
                        super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
            fav.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start < pfVar5;
            fav.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 fav.expressions.
                 super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(fav.expressions.
                         super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                         ._M_impl.super__Vector_impl_data._M_start)->p_expr;
          cav.env.
          super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                &(fav.expressions.
                  super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
                  ._M_impl.super__Vector_impl_data._M_start)->state;
          (fav.expressions.
           super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
           ._M_impl.super__Vector_impl_data._M_start)->state =
               fav.expressions.
               super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].state;
          (fav.expressions.
           super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
           ._M_impl.super__Vector_impl_data._M_start)->p_expr = pfVar5->p_expr;
          pfVar5->p_expr =
               (Expression *)
               cav.env.
               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          fav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].state =
               (e_fav_state)
               cav.env.
               super__Vector_base<std::shared_ptr<skiwi::environment<bool>_>,_std::allocator<std::shared_ptr<skiwi::environment<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          fav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::find_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::find_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = pfVar5;
        }
      }
      anon_unknown_26::find_assignable_variables::treat_expressions(&fav);
      anon_unknown_26::convert_assignable_variables::convert_assignable_variables(&cav);
      pvVar1 = (prog->expressions).
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar8 = (prog->expressions).
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1
          ) {
        local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
        local_d8._vptr__Sp_counted_base = (_func_int **)pvVar8;
        std::
        vector<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
        ::push_back(&cav.expressions,(value_type *)&local_d8);
      }
      if (cav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          cav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        for (; pcVar6 = cav.expressions.
                        super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
            cav.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start < pcVar6;
            cav.expressions.
            super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 cav.expressions.
                 super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          local_d8._vptr__Sp_counted_base =
               (_func_int **)
               (cav.expressions.
                super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                ._M_impl.super__Vector_impl_data._M_start)->p_expr;
          local_d8._8_8_ =
               *(undefined8 *)
                &(cav.expressions.
                  super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
                  ._M_impl.super__Vector_impl_data._M_start)->state;
          (cav.expressions.
           super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
           ._M_impl.super__Vector_impl_data._M_start)->state =
               cav.expressions.
               super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].state;
          (cav.expressions.
           super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
           ._M_impl.super__Vector_impl_data._M_start)->p_expr = pcVar6->p_expr;
          pcVar6->p_expr = (Expression *)local_d8._vptr__Sp_counted_base;
          cav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].state = local_d8._M_use_count;
          cav.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::convert_assignable_variables_state,_std::allocator<skiwi::(anonymous_namespace)::convert_assignable_variables_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = pcVar6;
        }
      }
      anon_unknown_26::convert_assignable_variables::treat_expressions(&cav);
      anon_unknown_26::convert_assignable_variables::~convert_assignable_variables(&cav);
      anon_unknown_26::find_assignable_variables::~find_assignable_variables(&fav);
    }
  }
  prog->assignable_variables_converted = true;
  return;
}

Assistant:

void assignable_variable_conversion(Program& prog, const compiler_options& ops)
  {
  /*
  assert(prog.alpha_converted);
  find_assignable_variables fav;
  visitor<Program, find_assignable_variables>::visit(prog, &fav);
  convert_assignable_variables cav;
  //for (const auto& v : fav.assignable_variables)
  //  cav.env->push(v, true);
  visitor<Program, convert_assignable_variables>::visit(prog, &cav);
  prog.assignable_variables_converted = true;
  */
  assert(prog.alpha_converted);
  assert(prog.expressions.size() <= 1);

  if (prog.expressions.size() == 1)
    {
    Expression& e = prog.expressions.front();
    if (std::holds_alternative<Begin>(e))
      {
      Begin& beg = std::get<Begin>(e);
      size_t sz = beg.arguments.size();
      parallel_for(size_t(0), sz, [&](size_t i)
        {
        auto& arg = beg.arguments[i];
        find_assignable_variables fav;
        fav.expressions.push_back(&arg);
        fav.treat_expressions();
        convert_assignable_variables cav;
        cav.expressions.push_back(&arg);
        cav.treat_expressions();
        }, ops);
      }
    else
      {
      find_assignable_variables fav;
      for (auto& expr : prog.expressions)
        fav.expressions.push_back(&expr);
      std::reverse(fav.expressions.begin(), fav.expressions.end());
      fav.treat_expressions();
      convert_assignable_variables cav;
      for (auto& expr : prog.expressions)
        cav.expressions.push_back(&expr);
      std::reverse(cav.expressions.begin(), cav.expressions.end());
      cav.treat_expressions();
      }
    }
  prog.assignable_variables_converted = true;
  }